

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseDictionary.h
# Opt level: O1

void __thiscall
JsUtil::
SynchronizedDictionary<unsigned_int,Js::ParseableFunctionInfo*,Memory::RecyclerLeafAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,Js::DefaultContainerLockPolicy,CriticalSection>
::MapAndRemoveIf<Js::ParseableFunctionInfo::Parse(Js::ScriptFunction**,bool)::__0>
          (SynchronizedDictionary<unsigned_int,Js::ParseableFunctionInfo*,Memory::RecyclerLeafAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,Js::DefaultContainerLockPolicy,CriticalSection>
           *this,anon_class_8_1_8991fb9c fn)

{
  int iVar1;
  CCLock *this_00;
  ParseableFunctionInfo *this_01;
  int iVar2;
  ulong uVar3;
  long lVar4;
  char *addr;
  
  this_00 = *(CCLock **)(this + 0x38);
  CCLock::Enter(this_00);
  if (*(int *)(this + 0x1c) != 0) {
    uVar3 = 0;
    do {
      iVar2 = *(int *)(*(long *)this + uVar3 * 4);
      while (iVar2 != -1) {
        lVar4 = (long)iVar2 * 0x10;
        this_01 = *(ParseableFunctionInfo **)(*(long *)(this + 8) + lVar4);
        if (this_01 != fn.this && this_01 != (ParseableFunctionInfo *)0x0) {
          Js::ParseableFunctionInfo::Parse(this_01,(ScriptFunction **)0x0,false);
        }
        iVar1 = *(int *)(*(long *)(this + 8) + 8 + lVar4);
        addr = (char *)(*(long *)(this + 8) + lVar4);
        *(int *)(*(long *)this + uVar3 * 4) = iVar1;
        Memory::Recycler::WBSetBit(addr);
        addr[0] = '\0';
        addr[1] = '\0';
        addr[2] = '\0';
        addr[3] = '\0';
        addr[4] = '\0';
        addr[5] = '\0';
        addr[6] = '\0';
        addr[7] = '\0';
        Memory::RecyclerWriteBarrierManager::WriteBarrier(addr);
        addr[0xc] = '\0';
        addr[0xd] = '\0';
        addr[0xe] = '\0';
        addr[0xf] = '\0';
        BaseDictionary<unsigned_int,_Js::ParseableFunctionInfo_*,_Memory::RecyclerLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
        ::SetNextFreeEntryIndex
                  ((BaseDictionary<unsigned_int,_Js::ParseableFunctionInfo_*,_Memory::RecyclerLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                    *)this,(EntryType *)(lVar4 + *(long *)(this + 8)),
                   -(uint)(*(int *)(this + 0x28) == 0) | *(uint *)(this + 0x24));
        *(int *)(this + 0x24) = iVar2;
        *(int *)(this + 0x28) = *(int *)(this + 0x28) + 1;
        iVar2 = iVar1;
        if (*(DictionaryStats **)(this + 0x30) != (DictionaryStats *)0x0) {
          DictionaryStats::Remove
                    (*(DictionaryStats **)(this + 0x30),*(int *)(*(long *)this + uVar3 * 4) == -1);
        }
      }
      uVar3 = uVar3 + 1;
    } while (uVar3 < *(uint *)(this + 0x1c));
  }
  CCLock::Leave(this_00);
  return;
}

Assistant:

void MapAndRemoveIf(Fn fn)
        {
            typename LockPolicy::AddRemoveLock autoLock(syncObj);

            return __super::MapAndRemoveIf(fn);
        }